

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

ON_NurbsCage * __thiscall ON_NurbsCage::operator=(ON_NurbsCage *this,ON_BezierCage *src)

{
  bool bVar1;
  double *Point;
  int local_24;
  int local_20;
  int k;
  int j;
  int i;
  ON_BezierCage *src_local;
  ON_NurbsCage *this_local;
  
  bVar1 = Create(this,src->m_dim,(bool)(src->m_is_rat & 1),src->m_order[0],src->m_order[1],
                 src->m_order[2],src->m_order[0],src->m_order[1],src->m_order[2]);
  if (bVar1) {
    for (k = 0; k < this->m_cv_count[0]; k = k + 1) {
      for (local_20 = 0; local_20 < this->m_cv_count[1]; local_20 = local_20 + 1) {
        for (local_24 = 0; local_24 < this->m_cv_count[2]; local_24 = local_24 + 1) {
          Point = ON_BezierCage::CV(src,k,local_20,local_24);
          SetCV(this,k,local_20,local_24,intrinsic_point_style,Point);
        }
      }
    }
  }
  return this;
}

Assistant:

ON_NurbsCage& ON_NurbsCage::operator=( const ON_BezierCage& src )
{
  if ( Create(src.m_dim,src.m_is_rat,
              src.m_order[0],src.m_order[1],src.m_order[2],
              src.m_order[0],src.m_order[1],src.m_order[2]) )
  {
    int i,j,k;
    for ( i = 0; i < m_cv_count[0]; i++ )
    {
      for ( j = 0; j < m_cv_count[1]; j++ )
      {
        for ( k = 0; k < m_cv_count[2]; k++ )
        {
          SetCV(i,j,k,ON::intrinsic_point_style,src.CV(i,j,k));
        }           
      }
    }
  }
  return *this;
}